

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

parser_error parse_class_stats(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  void *pvVar3;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"str");
    *(wchar_t *)((long)pvVar3 + 0x68) = wVar1;
    wVar1 = parser_getint(p,"int");
    *(wchar_t *)((long)pvVar3 + 0x6c) = wVar1;
    wVar1 = parser_getint(p,"wis");
    *(wchar_t *)((long)pvVar3 + 0x70) = wVar1;
    wVar1 = parser_getint(p,"dex");
    *(wchar_t *)((long)pvVar3 + 0x74) = wVar1;
    wVar1 = parser_getint(p,"con");
    *(wchar_t *)((long)pvVar3 + 0x78) = wVar1;
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_class_stats(struct parser *p) {
	struct player_class *c = parser_priv(p);

	if (!c)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	c->c_adj[STAT_STR] = parser_getint(p, "str");
	c->c_adj[STAT_INT] = parser_getint(p, "int");
	c->c_adj[STAT_WIS] = parser_getint(p, "wis");
	c->c_adj[STAT_DEX] = parser_getint(p, "dex");
	c->c_adj[STAT_CON] = parser_getint(p, "con");
	return PARSE_ERROR_NONE;
}